

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void PollInputEvents(void)

{
  undefined1 *puVar1;
  float fVar2;
  bool bVar3;
  int k;
  int iVar4;
  long lVar5;
  long lVar6;
  int k_1;
  ulong uVar7;
  uint uVar8;
  int i;
  long lVar9;
  long lVar10;
  GLFWgamepadstate state;
  GLFWgamepadstate local_58;
  
  UpdateGestures();
  CORE.Input.Keyboard.keyPressedQueueCount = 0;
  CORE.Input.Keyboard.charPressedQueueCount = 0;
  CORE.Input.Gamepad.lastButtonPressed = 0;
  lVar5 = -0x200;
  do {
    CORE.Input.Keyboard.keyRepeatInFrame[lVar5] = CORE.Input.Keyboard.previousKeyState[lVar5];
    *(undefined1 *)((long)CORE.Input.Keyboard.keyPressedQueue + lVar5) = 0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  lVar5 = -8;
  do {
    CORE.Input.Mouse.previousButtonState[lVar5 + 8] = CORE.Input.Mouse.previousButtonState[lVar5];
    CORE.Input.Touch.position[0] = CORE.Input.Mouse.currentPosition;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  CORE.Input.Mouse.previousWheelMove = CORE.Input.Mouse.currentWheelMove;
  CORE.Input.Mouse.currentWheelMove.x = 0.0;
  CORE.Input.Mouse.currentWheelMove.y = 0.0;
  CORE.Input.Mouse.previousPosition = CORE.Input.Mouse.currentPosition;
  lVar5 = -8;
  do {
    *(char *)((long)CORE.Input.Gamepad.axisCount + lVar5 + -4) =
         CORE.Input.Touch.previousTouchState[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  lVar5 = 0;
  do {
    iVar4 = glfwJoystickPresent((int)lVar5);
    *(bool *)(lVar5 + 0x23b39c) = iVar4 != 0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar9 = 0x23b520;
  lVar5 = 0;
  do {
    if (CORE.Input.Gamepad.ready[lVar5] == true) {
      lVar10 = lVar5 * 0x20;
      lVar6 = 0;
      do {
        *(undefined1 *)(lVar9 + lVar6) = *(undefined1 *)(lVar9 + -0x80 + lVar6);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x20);
      local_58.axes[0] = 0.0;
      local_58.axes[1] = 0.0;
      local_58.axes[2] = 0.0;
      local_58.axes[3] = 0.0;
      local_58.buttons[0] = '\0';
      local_58.buttons[1] = '\0';
      local_58.buttons[2] = '\0';
      local_58.buttons[3] = '\0';
      local_58.buttons[4] = '\0';
      local_58.buttons[5] = '\0';
      local_58.buttons[6] = '\0';
      local_58.buttons[7] = '\0';
      local_58.buttons[8] = '\0';
      local_58.buttons[9] = '\0';
      local_58.buttons[10] = '\0';
      local_58.buttons[0xb] = '\0';
      local_58.buttons[0xc] = '\0';
      local_58.buttons[0xd] = '\0';
      local_58.buttons[0xe] = '\0';
      local_58._15_1_ = 0;
      local_58.axes[4] = 0.0;
      local_58.axes[5] = 0.0;
      glfwGetGamepadState((int)lVar5,&local_58);
      uVar7 = 0;
      do {
        switch(uVar7 & 0xffffffff) {
        case 0:
          uVar8 = 7;
          break;
        case 1:
          uVar8 = 6;
          break;
        case 2:
          uVar8 = 8;
          break;
        case 3:
          uVar8 = 5;
          break;
        case 4:
          uVar8 = 9;
          break;
        case 5:
          uVar8 = 0xb;
          break;
        case 6:
          uVar8 = 0xd;
          break;
        case 7:
          uVar8 = 0xf;
          break;
        case 8:
          uVar8 = 0xe;
          break;
        case 9:
          uVar8 = 0x10;
          break;
        case 10:
          uVar8 = 0x11;
          break;
        case 0xb:
          uVar8 = 1;
          break;
        case 0xc:
          uVar8 = 2;
          break;
        case 0xd:
          uVar8 = 3;
          break;
        case 0xe:
          uVar8 = 4;
          break;
        default:
          uVar8 = 0xffffffff;
          bVar3 = true;
          goto LAB_0016f9f9;
        }
        bVar3 = false;
LAB_0016f9f9:
        if (!bVar3) {
          puVar1 = (undefined1 *)((ulong)uVar8 + lVar10 + 0x23b4a0);
          if (local_58.buttons[uVar7] == '\x01') {
            *puVar1 = 1;
            CORE.Input.Gamepad.lastButtonPressed = uVar8;
          }
          else {
            *puVar1 = 0;
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x20);
      *(undefined8 *)(CORE.Input.Gamepad.axisState[lVar5] + 4) = local_58.axes._16_8_;
      *(undefined8 *)CORE.Input.Gamepad.axisState[lVar5] = local_58.axes._0_8_;
      *(undefined8 *)(CORE.Input.Gamepad.axisState[lVar5] + 2) = local_58.axes._8_8_;
      fVar2 = CORE.Input.Gamepad.axisState[lVar5][5];
      *(bool *)(lVar10 + 0x23b4aa) = 0.1 < CORE.Input.Gamepad.axisState[lVar5][4];
      *(bool *)(lVar10 + 0x23b4ac) = 0.1 < fVar2;
      CORE.Input.Gamepad.axisCount[lVar5] = 6;
    }
    lVar5 = lVar5 + 1;
    lVar9 = lVar9 + 0x20;
    if (lVar5 == 4) {
      CORE.Window.resizedLastFrame = false;
      if (CORE.Window.eventWaiting == false) {
        glfwPollEvents();
      }
      else {
        glfwWaitEvents();
      }
      while ((CORE.Window.flags & 0x300) == 0x200) {
        glfwWaitEvents();
      }
      iVar4 = glfwWindowShouldClose(platform.handle);
      CORE.Window.shouldClose = iVar4 != 0;
      glfwSetWindowShouldClose(platform.handle,0);
      return;
    }
  } while( true );
}

Assistant:

void PollInputEvents(void)
{
#if defined(SUPPORT_GESTURES_SYSTEM)
    // NOTE: Gestures update must be called every frame to reset gestures correctly
    // because ProcessGestureEvent() is just called on an event, not every frame
    UpdateGestures();
#endif

    // Reset keys/chars pressed registered
    CORE.Input.Keyboard.keyPressedQueueCount = 0;
    CORE.Input.Keyboard.charPressedQueueCount = 0;

    // Reset last gamepad button/axis registered state
    CORE.Input.Gamepad.lastButtonPressed = 0;       // GAMEPAD_BUTTON_UNKNOWN
    //CORE.Input.Gamepad.axisCount = 0;

    // Keyboard/Mouse input polling (automatically managed by GLFW3 through callback)

    // Register previous keys states
    for (int i = 0; i < MAX_KEYBOARD_KEYS; i++)
    {
        CORE.Input.Keyboard.previousKeyState[i] = CORE.Input.Keyboard.currentKeyState[i];
        CORE.Input.Keyboard.keyRepeatInFrame[i] = 0;
    }

    // Register previous mouse states
    for (int i = 0; i < MAX_MOUSE_BUTTONS; i++) CORE.Input.Mouse.previousButtonState[i] = CORE.Input.Mouse.currentButtonState[i];

    // Register previous mouse wheel state
    CORE.Input.Mouse.previousWheelMove = CORE.Input.Mouse.currentWheelMove;
    CORE.Input.Mouse.currentWheelMove = (Vector2){ 0.0f, 0.0f };

    // Register previous mouse position
    CORE.Input.Mouse.previousPosition = CORE.Input.Mouse.currentPosition;

    // Register previous touch states
    for (int i = 0; i < MAX_TOUCH_POINTS; i++) CORE.Input.Touch.previousTouchState[i] = CORE.Input.Touch.currentTouchState[i];

    // Reset touch positions
    //for (int i = 0; i < MAX_TOUCH_POINTS; i++) CORE.Input.Touch.position[i] = (Vector2){ 0, 0 };

    // Map touch position to mouse position for convenience
    // WARNING: If the target desktop device supports touch screen, this behaviour should be reviewed!
    // TODO: GLFW does not support multi-touch input just yet
    // https://www.codeproject.com/Articles/668404/Programming-for-Multi-Touch
    // https://docs.microsoft.com/en-us/windows/win32/wintouch/getting-started-with-multi-touch-messages
    CORE.Input.Touch.position[0] = CORE.Input.Mouse.currentPosition;

    // Check if gamepads are ready
    // NOTE: We do it here in case of disconnection
    for (int i = 0; i < MAX_GAMEPADS; i++)
    {
        if (glfwJoystickPresent(i)) CORE.Input.Gamepad.ready[i] = true;
        else CORE.Input.Gamepad.ready[i] = false;
    }

    // Register gamepads buttons events
    for (int i = 0; i < MAX_GAMEPADS; i++)
    {
        if (CORE.Input.Gamepad.ready[i])     // Check if gamepad is available
        {
            // Register previous gamepad states
            for (int k = 0; k < MAX_GAMEPAD_BUTTONS; k++) CORE.Input.Gamepad.previousButtonState[i][k] = CORE.Input.Gamepad.currentButtonState[i][k];

            // Get current gamepad state
            // NOTE: There is no callback available, so we get it manually
            GLFWgamepadstate state = { 0 };
            glfwGetGamepadState(i, &state); // This remapps all gamepads so they have their buttons mapped like an xbox controller

            const unsigned char *buttons = state.buttons;

            for (int k = 0; (buttons != NULL) && (k < MAX_GAMEPAD_BUTTONS); k++)
            {
                int button = -1;        // GamepadButton enum values assigned

                switch (k)
                {
                    case GLFW_GAMEPAD_BUTTON_Y: button = GAMEPAD_BUTTON_RIGHT_FACE_UP; break;
                    case GLFW_GAMEPAD_BUTTON_B: button = GAMEPAD_BUTTON_RIGHT_FACE_RIGHT; break;
                    case GLFW_GAMEPAD_BUTTON_A: button = GAMEPAD_BUTTON_RIGHT_FACE_DOWN; break;
                    case GLFW_GAMEPAD_BUTTON_X: button = GAMEPAD_BUTTON_RIGHT_FACE_LEFT; break;

                    case GLFW_GAMEPAD_BUTTON_LEFT_BUMPER: button = GAMEPAD_BUTTON_LEFT_TRIGGER_1; break;
                    case GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER: button = GAMEPAD_BUTTON_RIGHT_TRIGGER_1; break;

                    case GLFW_GAMEPAD_BUTTON_BACK: button = GAMEPAD_BUTTON_MIDDLE_LEFT; break;
                    case GLFW_GAMEPAD_BUTTON_GUIDE: button = GAMEPAD_BUTTON_MIDDLE; break;
                    case GLFW_GAMEPAD_BUTTON_START: button = GAMEPAD_BUTTON_MIDDLE_RIGHT; break;

                    case GLFW_GAMEPAD_BUTTON_DPAD_UP: button = GAMEPAD_BUTTON_LEFT_FACE_UP; break;
                    case GLFW_GAMEPAD_BUTTON_DPAD_RIGHT: button = GAMEPAD_BUTTON_LEFT_FACE_RIGHT; break;
                    case GLFW_GAMEPAD_BUTTON_DPAD_DOWN: button = GAMEPAD_BUTTON_LEFT_FACE_DOWN; break;
                    case GLFW_GAMEPAD_BUTTON_DPAD_LEFT: button = GAMEPAD_BUTTON_LEFT_FACE_LEFT; break;

                    case GLFW_GAMEPAD_BUTTON_LEFT_THUMB: button = GAMEPAD_BUTTON_LEFT_THUMB; break;
                    case GLFW_GAMEPAD_BUTTON_RIGHT_THUMB: button = GAMEPAD_BUTTON_RIGHT_THUMB; break;
                    default: break;
                }

                if (button != -1)   // Check for valid button
                {
                    if (buttons[k] == GLFW_PRESS)
                    {
                        CORE.Input.Gamepad.currentButtonState[i][button] = 1;
                        CORE.Input.Gamepad.lastButtonPressed = button;
                    }
                    else CORE.Input.Gamepad.currentButtonState[i][button] = 0;
                }
            }

            // Get current axis state
            const float *axes = state.axes;

            for (int k = 0; (axes != NULL) && (k < GLFW_GAMEPAD_AXIS_LAST + 1); k++)
            {
                CORE.Input.Gamepad.axisState[i][k] = axes[k];
            }

            // Register buttons for 2nd triggers (because GLFW doesn't count these as buttons but rather axis)
            CORE.Input.Gamepad.currentButtonState[i][GAMEPAD_BUTTON_LEFT_TRIGGER_2] = (char)(CORE.Input.Gamepad.axisState[i][GAMEPAD_AXIS_LEFT_TRIGGER] > 0.1f);
            CORE.Input.Gamepad.currentButtonState[i][GAMEPAD_BUTTON_RIGHT_TRIGGER_2] = (char)(CORE.Input.Gamepad.axisState[i][GAMEPAD_AXIS_RIGHT_TRIGGER] > 0.1f);

            CORE.Input.Gamepad.axisCount[i] = GLFW_GAMEPAD_AXIS_LAST + 1;
        }
    }

    CORE.Window.resizedLastFrame = false;

    if (CORE.Window.eventWaiting) glfwWaitEvents();     // Wait for in input events before continue (drawing is paused)
    else glfwPollEvents();      // Poll input events: keyboard/mouse/window events (callbacks) -> Update keys state

    // While window minimized, stop loop execution
    while (IsWindowState(FLAG_WINDOW_MINIMIZED) && !IsWindowState(FLAG_WINDOW_ALWAYS_RUN)) glfwWaitEvents();

    CORE.Window.shouldClose = glfwWindowShouldClose(platform.handle);

    // Reset close status for next frame
    glfwSetWindowShouldClose(platform.handle, GLFW_FALSE);
}